

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

bool __thiscall QWizardPage::isComplete(QWizardPage *this)

{
  char cVar1;
  bool bVar2;
  QLineEdit *this_00;
  QAbstractSpinBox *this_01;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (lVar4 == 0) {
    bVar5 = true;
  }
  else {
    lVar4 = *(long *)(lVar4 + 8);
    lVar3 = *(long *)(lVar4 + 0x2f8);
    bVar5 = lVar3 == 0;
    if (!bVar5) {
      lVar4 = *(long *)(lVar4 + 0x2f0) + lVar3 * 0x80 + -0x20;
      lVar3 = lVar3 * -0x80;
      do {
        if ((*(QWizardPage **)(lVar4 + -0x60) == this) && (*(char *)(lVar4 + -0x40) == '\x01')) {
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QObject::property((char *)local_58.data);
          cVar1 = ::QVariant::equals((QVariant *)&local_58);
          if (((cVar1 != '\0') ||
              ((this_00 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject),
               this_00 != (QLineEdit *)0x0 &&
               (bVar2 = QLineEdit::hasAcceptableInput(this_00), !bVar2)))) ||
             ((this_01 = (QAbstractSpinBox *)
                         QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject),
              this_01 != (QAbstractSpinBox *)0x0 &&
              (bVar2 = QAbstractSpinBox::hasAcceptableInput(this_01), !bVar2)))) {
            ::QVariant::~QVariant((QVariant *)&local_58);
            break;
          }
          ::QVariant::~QVariant((QVariant *)&local_58);
        }
        lVar4 = lVar4 + -0x80;
        lVar3 = lVar3 + 0x80;
        bVar5 = lVar3 == 0;
      } while (!bVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPage::isComplete() const
{
    Q_D(const QWizardPage);

    if (!d->wizard)
        return true;

    const QList<QWizardField> &wizardFields = d->wizard->d_func()->fields;
    const auto end = wizardFields.crend();
    for (auto it = wizardFields.crbegin(); it != end; ++it) {
        const QWizardField &field = *it;
        if (field.page == this && field.mandatory) {
            QVariant value = field.object->property(field.property);
            if (value == field.initialValue)
                return false;

#if QT_CONFIG(lineedit)
            if (QLineEdit *lineEdit = qobject_cast<QLineEdit *>(field.object)) {
                if (!lineEdit->hasAcceptableInput())
                    return false;
            }
#endif
#if QT_CONFIG(spinbox)
            if (QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(field.object)) {
                if (!spinBox->hasAcceptableInput())
                    return false;
            }
#endif
        }
    }
    return true;
}